

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

DisableForkStatement * __thiscall
slang::BumpAllocator::emplace<slang::ast::DisableForkStatement,slang::SourceRange>
          (BumpAllocator *this,SourceRange *args)

{
  SourceRange sourceRange;
  DisableForkStatement *pDVar1;
  SourceLocation in_RSI;
  BumpAllocator *in_RDI;
  size_t in_stack_ffffffffffffffe8;
  
  pDVar1 = (DisableForkStatement *)allocate(in_RDI,(size_t)in_RSI,in_stack_ffffffffffffffe8);
  sourceRange.endLoc = in_RSI;
  sourceRange.startLoc = *(SourceLocation *)((long)in_RSI + 8);
  ast::DisableForkStatement::DisableForkStatement(*(DisableForkStatement **)in_RSI,sourceRange);
  return pDVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }